

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::order(Forth *this)

{
  bool bVar1;
  reference piVar2;
  ostream *poVar3;
  undefined1 local_20 [8];
  reverse_iterator itEnd;
  reverse_iterator it;
  Forth *this_local;
  
  std::vector<int,_std::allocator<int>_>::rbegin((vector<int,_std::allocator<int>_> *)&itEnd);
  std::vector<int,_std::allocator<int>_>::rend((vector<int,_std::allocator<int>_> *)local_20);
  while (bVar1 = std::
                 operator==<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                           (&itEnd,(reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                                    *)local_20), ((bVar1 ^ 0xffU) & 1) != 0) {
    if (this->writeToTarget == ToString) {
      poVar3 = std::operator<<((ostream *)&this->field_0x20,"wid");
      piVar2 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator*(&itEnd);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar2);
      std::operator<<(poVar3," ");
    }
    else if (this->writeToTarget == ToStdCout) {
      poVar3 = std::operator<<((ostream *)&std::cout,"wid");
      piVar2 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator*(&itEnd);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar2);
      std::operator<<(poVar3," ");
      std::ostream::flush();
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
    ::operator++(&itEnd);
  }
  if (this->writeToTarget == ToString) {
    poVar3 = std::operator<<((ostream *)&this->field_0x20,"wid");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->searchOrderCurrent);
    std::operator<<(poVar3," ");
  }
  else if (this->writeToTarget == ToStdCout) {
    poVar3 = std::operator<<((ostream *)&std::cout,"wid");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->searchOrderCurrent);
    std::operator<<(poVar3," ");
    std::ostream::flush();
  }
  return;
}

Assistant:

void order(){
			for(auto it=searchOrder.rbegin(),itEnd=searchOrder.rend();it!=itEnd;++it){
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
				
				switch (writeToTarget) {
				case ToString:
					std_cout << "wid" << (*it)<< " ";
					break;
				case ToStdCout:
					std::cout << "wid" << (*it)<< " ";;
					std::cout.flush();
					break;
				default:
					break;
				}
#endif
			}					
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT			
			switch (writeToTarget) {
			case ToString:
				std_cout << "wid" << searchOrderCurrent << " ";
				break;
			case ToStdCout:
				std::cout << "wid" << searchOrderCurrent << " ";;
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}